

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<kj::AsyncCapabilityStream> * __thiscall
kj::Own<kj::AsyncCapabilityStream>::operator=
          (Own<kj::AsyncCapabilityStream> *this,Own<kj::AsyncCapabilityStream> *other)

{
  Disposer *this_00;
  AsyncCapabilityStream *object;
  AsyncCapabilityStream *ptrCopy;
  Disposer *disposerCopy;
  Own<kj::AsyncCapabilityStream> *other_local;
  Own<kj::AsyncCapabilityStream> *this_local;
  
  this_00 = this->disposer;
  object = this->ptr;
  this->disposer = other->disposer;
  this->ptr = other->ptr;
  other->ptr = (AsyncCapabilityStream *)0x0;
  if (object != (AsyncCapabilityStream *)0x0) {
    Disposer::dispose<kj::AsyncCapabilityStream>(this_00,object);
  }
  return this;
}

Assistant:

inline Own& operator=(Own&& other) {
    // Move-assingnment operator.

    // Careful, this might own `other`.  Therefore we have to transfer the pointers first, then
    // dispose.
    const Disposer* disposerCopy = disposer;
    T* ptrCopy = ptr;
    disposer = other.disposer;
    ptr = other.ptr;
    other.ptr = nullptr;
    if (ptrCopy != nullptr) {
      disposerCopy->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
    return *this;
  }